

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache.cpp
# Opt level: O3

bool __thiscall QCacheItem::canCompress(QCacheItem *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char cVar5;
  storage_type *psVar6;
  bool bVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QHttpHeaders h;
  QNetworkCacheMetaData local_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40.d.d.ptr = (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkCacheMetaData::headers(&local_40);
  bVar7 = false;
  QVar9 = QHttpHeaders::value((QHttpHeaders *)&local_40,ContentLength,(QByteArrayView)ZEXT816(0));
  if ((storage_type *)QVar9.m_size != (storage_type *)0x0) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    QVar8.m_data = (storage_type *)QVar9.m_size;
    QVar8.m_size = (qsizetype)&local_38;
    QtPrivate::toSignedInteger(QVar8,(int)QVar9.m_data);
    if ((((ulong)puStack_30 & 1) == 0) && (0x300000 < (long)local_38)) {
      bVar7 = false;
    }
    else {
      bVar7 = false;
      QVar9 = QHttpHeaders::value((QHttpHeaders *)&local_40,ContentType,(QByteArrayView)ZEXT816(0));
      psVar6 = QVar9.m_data;
      if (QVar9.m_size == 0) {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = psVar6;
        QVar9.m_data = "text/";
        QVar9.m_size = 5;
        cVar5 = QtPrivate::startsWith((QByteArrayView)(auVar1 << 0x40),QVar9);
        if (cVar5 == '\0') {
          bVar7 = false;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = psVar6;
          QVar10.m_data = "application/";
          QVar10.m_size = 0xc;
          cVar5 = QtPrivate::startsWith((QByteArrayView)(auVar2 << 0x40),QVar10);
          if (cVar5 == '\0') goto LAB_001d43ce;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = psVar6;
          QVar11.m_data = "javascript";
          QVar11.m_size = 10;
          cVar5 = QtPrivate::endsWith((QByteArrayView)(auVar3 << 0x40),QVar11);
          if (cVar5 == '\0') {
            bVar7 = false;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = psVar6;
            QVar12.m_data = "ecmascript";
            QVar12.m_size = 10;
            cVar5 = QtPrivate::endsWith((QByteArrayView)(auVar4 << 0x40),QVar12);
            if (cVar5 == '\0') goto LAB_001d43ce;
          }
        }
        bVar7 = true;
      }
    }
  }
LAB_001d43ce:
  QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QCacheItem::canCompress() const
{
    const auto h = metaData.headers();

    const auto sizeValue = h.value(QHttpHeaders::WellKnownHeader::ContentLength);
    if (sizeValue.empty())
        return false;

    qint64 size = sizeValue.toLongLong();
    if (size > MAX_COMPRESSION_SIZE)
        return false;

    const auto type = h.value(QHttpHeaders::WellKnownHeader::ContentType);
    if (!type.empty())
        return false;

    if (!type.startsWith("text/")
        && !(type.startsWith("application/")
            && (type.endsWith("javascript") || type.endsWith("ecmascript")))) {
        return false;
    }

    return true;
}